

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void windowReadPeerValues(WindowCodeArg *p,int csr,int reg)

{
  int iVar1;
  Window *pWVar2;
  ExprList *pEVar3;
  Vdbe *p_00;
  int iVar4;
  int iVar5;
  
  pWVar2 = p->pMWin;
  pEVar3 = pWVar2->pOrderBy;
  if (pEVar3 != (ExprList *)0x0) {
    p_00 = sqlite3GetVdbe(p->pParse);
    if (pWVar2->pPartition == (ExprList *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = pWVar2->pPartition->nExpr;
    }
    if (0 < pEVar3->nExpr) {
      iVar1 = pWVar2->nBufferCol;
      iVar5 = 0;
      do {
        sqlite3VdbeAddOp3(p_00,0x5e,csr,iVar4 + iVar1 + iVar5,reg + iVar5);
        iVar5 = iVar5 + 1;
      } while (iVar5 < pEVar3->nExpr);
    }
  }
  return;
}

Assistant:

static void windowReadPeerValues(
  WindowCodeArg *p,
  int csr,
  int reg
){
  Window *pMWin = p->pMWin;
  ExprList *pOrderBy = pMWin->pOrderBy;
  if( pOrderBy ){
    Vdbe *v = sqlite3GetVdbe(p->pParse);
    ExprList *pPart = pMWin->pPartition;
    int iColOff = pMWin->nBufferCol + (pPart ? pPart->nExpr : 0);
    int i;
    for(i=0; i<pOrderBy->nExpr; i++){
      sqlite3VdbeAddOp3(v, OP_Column, csr, iColOff+i, reg+i);
    }
  }
}